

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::dumpSourceInstructions(Builder *this,Vector<unsigned_int> *out)

{
  size_type sVar1;
  size_type __pos;
  String subString;
  Instruction sourceInst;
  Instruction sourceContinuedInst;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_c0;
  Instruction local_a0;
  Instruction local_68;
  
  if (this->source == SourceLanguageUnknown) {
    return;
  }
  local_a0._vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
  local_a0.resultId = 0;
  local_a0.typeId = 0;
  local_a0.opCode = OpSource;
  local_a0.operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.block = (Block *)0x0;
  Instruction::addImmediateOperand(&local_a0,this->source);
  Instruction::addImmediateOperand(&local_a0,this->sourceVersion);
  if (this->sourceFileStringId != 0) {
    Instruction::addIdOperand(&local_a0,this->sourceFileStringId);
    sVar1 = (this->sourceText)._M_string_length;
    if (sVar1 != 0) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      for (__pos = 0; (long)__pos < (long)(int)sVar1; __pos = __pos + 0x3ffeb) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)&local_68,&this->sourceText,__pos,0x3ffeb);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                  (&local_c0,
                   (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)&local_68);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                       *)&local_68);
        if (__pos == 0) {
          Instruction::addStringOperand(&local_a0,local_c0._M_dataplus._M_p);
          Instruction::dump(&local_a0,out);
        }
        else {
          local_68._vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
          local_68.resultId = 0;
          local_68.typeId = 0;
          local_68.opCode = OpSourceContinued;
          local_68.operands.
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_68.block = (Block *)0x0;
          local_68.operands.
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.operands.
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          Instruction::addStringOperand(&local_68,local_c0._M_dataplus._M_p);
          Instruction::dump(&local_68,out);
          Instruction::~Instruction(&local_68);
        }
        sVar1 = (this->sourceText)._M_string_length;
      }
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string(&local_c0);
      goto LAB_0019d4f4;
    }
  }
  Instruction::dump(&local_a0,out);
LAB_0019d4f4:
  Instruction::~Instruction(&local_a0);
  return;
}

Assistant:

void Builder::dumpSourceInstructions(dxil_spv::Vector<unsigned int>& out) const
{
    const int maxWordCount = 0xFFFF;
    const int opSourceWordCount = 4;
    const int nonNullBytesPerInstruction = 4 * (maxWordCount - opSourceWordCount) - 1;

    if (source != SourceLanguageUnknown) {
        // OpSource Language Version File Source
        Instruction sourceInst(NoResult, NoType, OpSource);
        sourceInst.addImmediateOperand(source);
        sourceInst.addImmediateOperand(sourceVersion);
        // File operand
        if (sourceFileStringId != NoResult) {
            sourceInst.addIdOperand(sourceFileStringId);
            // Source operand
            if (sourceText.size() > 0) {
                int nextByte = 0;
                dxil_spv::String subString;
                while ((int)sourceText.size() - nextByte > 0) {
                    subString = sourceText.substr(nextByte, nonNullBytesPerInstruction);
                    if (nextByte == 0) {
                        // OpSource
                        sourceInst.addStringOperand(subString.c_str());
                        sourceInst.dump(out);
                    } else {
                        // OpSourcContinued
                        Instruction sourceContinuedInst(OpSourceContinued);
                        sourceContinuedInst.addStringOperand(subString.c_str());
                        sourceContinuedInst.dump(out);
                    }
                    nextByte += nonNullBytesPerInstruction;
                }
            } else
                sourceInst.dump(out);
        } else
            sourceInst.dump(out);
    }
}